

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O0

uint64_t GDSfloatCalc(double inVar)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  int local_50;
  int local_4c;
  int i_1;
  int i;
  unsigned_long_long mantissa;
  unsigned_long_long exponent;
  unsigned_long_long sign;
  double deci;
  unsigned_long_long integral;
  uint64_t GDSdec;
  double inVar_local;
  
  integral = 0;
  mantissa = 0x50;
  if ((inVar != 0.0) || (NAN(inVar))) {
    GDSdec = (uint64_t)inVar;
    if (inVar < 0.0) {
      GDSdec = (uint64_t)(inVar * -1.0);
    }
    exponent = (unsigned_long_long)(inVar < 0.0);
    _i_1 = (long)(double)GDSdec |
           (long)((double)GDSdec - 9.223372036854776e+18) & (long)(double)GDSdec >> 0x3f;
    auVar4._8_4_ = (int)(_i_1 >> 0x20);
    auVar4._0_8_ = _i_1;
    auVar4._12_4_ = 0x45300000;
    sign = (unsigned_long_long)
           ((double)GDSdec -
           ((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)_i_1) - 4503599627370496.0)));
    for (local_4c = 0x3f; -1 < local_4c; local_4c = local_4c + -1) {
      sign = (unsigned_long_long)((double)sign * 2.0);
      if (1.0 <= (double)sign) {
        uVar1 = bitShiftL(1,local_4c);
        integral = integral | uVar1;
        sign = (unsigned_long_long)((double)sign + -1.0);
      }
      if (((double)sign == 0.0) && (!NAN((double)sign))) break;
    }
    local_50 = 0xf;
    while ((-1 < local_50 && (uVar1 = bitShiftR(_i_1,0x3b), (uVar1 & 0xffff) == 0))) {
      mantissa = mantissa - 1;
      uVar1 = bitShiftR(integral,local_50 << 2);
      _i_1 = _i_1 << 4 | uVar1 & 0xf;
      local_50 = local_50 + -1;
    }
    uVar1 = bitShiftL(exponent,0x3f);
    uVar2 = bitShiftL(mantissa,0x38);
    uVar3 = bitShiftR(_i_1,8);
    inVar_local = (double)(uVar1 | uVar2 | uVar3);
  }
  else {
    inVar_local = 0.0;
  }
  return (uint64_t)inVar_local;
}

Assistant:

uint64_t GDSfloatCalc(double inVar)
{
  uint64_t GDSdec = 0;
  unsigned long long integral;
  double deci;
  unsigned long long sign = 0;
  unsigned long long exponent = 80;
  unsigned long long mantissa = 0;

  if (inVar == 0)
    return 0;

  if (inVar < 0) {
    inVar *= -1;
    sign = 1;
  }

  integral = inVar;
  deci = inVar - integral;

  // Calculating the decimal
  for (int i = 63; i >= 0; i--) {
    deci *= 2;
    if (deci >= 1) {
      GDSdec = GDSdec | bitShiftL(1, i);
      deci--;
    }
    if (deci == 0)
      break;
  }

  mantissa = integral;
  for (int i = 15; i >= 0; i--) {
    if ((bitShiftR(mantissa, 59) & 0xffff) > 0)
      break;
    mantissa = mantissa << 4;
    exponent--;
    mantissa = mantissa | (bitShiftR(GDSdec, 4 * i) & 0xf);
  }

  sign = bitShiftL(sign, 63);
  exponent = bitShiftL(exponent, 56);
  mantissa = bitShiftR(mantissa, 8);

  return sign | exponent | mantissa;
}